

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

int has_ext(char *ext)

{
  byte *__haystack;
  int iVar1;
  GLubyte *__s1;
  byte *__haystack_00;
  byte *pbVar2;
  size_t sVar3;
  GLuint GVar4;
  uint uVar5;
  GLint num_exts;
  int local_2c;
  
  if ((GLVersion.major < 3) || (glad_glGetStringi == (PFNGLGETSTRINGIPROC)0x0)) {
    __haystack_00 = (*glad_glGetString)(0x1f03);
    uVar5 = 0;
    if ((ext != (char *)0x0 && __haystack_00 != (byte *)0x0) &&
       (pbVar2 = (byte *)strstr((char *)__haystack_00,ext), pbVar2 != (byte *)0x0)) {
      sVar3 = strlen(ext);
      do {
        __haystack = pbVar2 + sVar3;
        if (((pbVar2 == __haystack_00) || (pbVar2[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) {
          return 1;
        }
        pbVar2 = (byte *)strstr((char *)__haystack,ext);
        __haystack_00 = __haystack;
        uVar5 = 0;
      } while (pbVar2 != (byte *)0x0);
    }
  }
  else {
    (*glad_glGetIntegerv)(0x821d,&local_2c);
    if (local_2c < 1) {
      uVar5 = 0;
    }
    else {
      GVar4 = 0;
      do {
        __s1 = (*glad_glGetStringi)(0x1f03,GVar4);
        iVar1 = strcmp((char *)__s1,ext);
        if (iVar1 == 0) break;
        GVar4 = GVar4 + 1;
      } while ((int)GVar4 < local_2c);
      uVar5 = (uint)(iVar1 == 0);
    }
  }
  return uVar5;
}

Assistant:

static int has_ext(const char *ext) {
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    if(GLVersion.major < 3 || glGetStringi == NULL) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = (const char*) glGetString(GL_EXTENSIONS);
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    } else {
        GLint num_exts, index;

        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
        for(index = 0; index < num_exts; index++) {
            if(strcmp((const char*) glGetStringi(GL_EXTENSIONS, index), ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}